

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

Variable LiteScript::CreateVariable(Memory *memory,int count,char **keys,Variable *values)

{
  char *name;
  Object *pOVar1;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  Variable VVar4;
  Variable local_40;
  
  Memory::Create(memory,(Type *)CONCAT44(in_register_00000034,count));
  pOVar1 = Variable::operator->((Variable *)memory);
  puVar2 = extraout_RDX;
  if ((int)keys != 0) {
    name = (char *)pOVar1->data;
    uVar3 = 0;
    do {
      Array::operator[]((Array *)&stack0xffffffffffffffb0,name);
      Variable::operator=(&local_40,(Variable *)&stack0xffffffffffffffb0);
      Variable::~Variable(&local_40);
      Variable::~Variable((Variable *)&stack0xffffffffffffffb0);
      uVar3 = uVar3 + 1;
      puVar2 = extraout_RDX_00;
    } while (((ulong)keys & 0xffffffff) != uVar3);
  }
  VVar4.nb_ref = puVar2;
  VVar4.obj = (Object *)memory;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, int count, const char **keys, const Variable *values) {
    Variable v = memory.Create(Type::ARRAY);
    Array& a = v->GetData<Array>();
    for (unsigned int i = 0, sz = (unsigned int)count; i < sz; i++)
        a[keys[i]] = values[i];
    return v;
}